

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

wave_object wave_init(char *wname)

{
  int iVar1;
  wave_object __dest;
  long lVar2;
  
  if (wname == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = filtlength(wname);
  }
  lVar2 = (long)iVar1;
  __dest = (wave_object)malloc(lVar2 * 0x20 + 0x68);
  __dest->filtlength = iVar1;
  __dest->hpr_len = iVar1;
  __dest->lpr_len = iVar1;
  __dest->hpd_len = iVar1;
  __dest->lpd_len = iVar1;
  strcpy((char *)__dest,wname);
  if (wname != (char *)0x0) {
    filtcoef(wname,(double *)(__dest + 1),(double *)(__dest[1].wname + lVar2 * 8),
             (double *)(__dest[1].wname + (long)(iVar1 * 2) * 8),
             (double *)(__dest[1].wname + (long)(iVar1 * 3) * 8));
  }
  __dest->lpd = (double *)(__dest + 1);
  __dest->hpd = (double *)(__dest[1].wname + lVar2 * 8);
  __dest->lpr = (double *)(__dest[1].wname + (long)(iVar1 * 2) * 8);
  __dest->hpr = (double *)(__dest[1].wname + (long)(iVar1 * 3) * 8);
  return __dest;
}

Assistant:

wave_object wave_init(const char* wname) {
	wave_object obj = NULL;
	int retval;
	retval = 0;

	if (wname != NULL) {
		retval = filtlength(wname);
		//obj->filtlength = retval;
		//strcopy(obj->wname, wname);
	}

	obj = (wave_object)malloc(sizeof(struct wave_set) + sizeof(double)* 4 * retval);

	obj->filtlength = retval;
	obj->lpd_len = obj->hpd_len = obj->lpr_len = obj->hpr_len = obj->filtlength;
	strcpy(obj->wname, wname);
	if (wname != NULL) {
		filtcoef(wname,obj->params,obj->params+retval,obj->params+2*retval,obj->params+3*retval);
	}
	obj->lpd = &obj->params[0];
	obj->hpd = &obj->params[retval];
	obj->lpr = &obj->params[2 * retval];
	obj->hpr = &obj->params[3 * retval];
	return obj;
}